

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O2

void __thiscall
duckdb::DbpDecoder::GetBatchInternal<long,true>
          (DbpDecoder *this,data_ptr_t target_values_ptr,idx_t batch_size)

{
  uint64_t *puVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  if (batch_size == 0) {
    return;
  }
  bVar10 = this->is_first_value == true;
  if (bVar10) {
    this->is_first_value = false;
  }
  uVar9 = (ulong)bVar10;
  do {
    uVar7 = batch_size - uVar9;
    while( true ) {
      if (batch_size <= uVar9) {
        return;
      }
      iVar3 = this->unpacked_data_offset;
      uVar6 = 0x20 - iVar3;
      uVar5 = uVar6;
      if (uVar7 < uVar6) {
        uVar5 = uVar7;
      }
      if (uVar5 != 0) break;
      iVar3 = this->miniblock_index;
      if (this->miniblock_offset == this->number_of_values_in_a_miniblock) {
        this->miniblock_offset = 0;
        iVar3 = iVar3 + 1;
        this->miniblock_index = iVar3;
        if (iVar3 == this->number_of_miniblocks_per_block) {
          uVar4 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(&this->buffer_);
          this->min_delta = -(ulong)((uint)uVar4 & 1) ^ uVar4 >> 1;
          ByteBuffer::available(&this->buffer_,this->number_of_miniblocks_per_block);
          pdVar2 = (this->buffer_).ptr;
          iVar3 = this->number_of_miniblocks_per_block;
          this->list_of_bitwidths_of_miniblocks = pdVar2;
          puVar1 = &(this->buffer_).len;
          *puVar1 = *puVar1 - iVar3;
          (this->buffer_).ptr = pdVar2 + iVar3;
          this->miniblock_index = 0;
          iVar3 = 0;
        }
      }
      ParquetDecodeUtils::BitUnpackAligned<unsigned_long>
                (&this->buffer_,this->unpacked_data,0x20,
                 this->list_of_bitwidths_of_miniblocks[iVar3]);
      this->unpacked_data_offset = 0;
      this->miniblock_offset = this->miniblock_offset + 0x20;
    }
    lVar8 = this->previous_value;
    if (uVar7 < uVar6) {
      uVar6 = uVar7;
    }
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      lVar8 = lVar8 + this->min_delta + this->unpacked_data[iVar3 + uVar7];
      this->previous_value = lVar8;
    }
    uVar9 = uVar9 + uVar5;
    this->unpacked_data_offset = iVar3 + uVar5;
  } while( true );
}

Assistant:

void GetBatchInternal(const data_ptr_t target_values_ptr, const idx_t batch_size) {
		if (batch_size == 0) {
			return;
		}
		D_ASSERT(target_values_ptr || SKIP_READ);

		T *target_values = nullptr;
		if (!SKIP_READ) {
			target_values = reinterpret_cast<T *>(target_values_ptr);
		}
		idx_t target_values_offset = 0;
		if (is_first_value) {
			if (!SKIP_READ) {
				target_values[0] = static_cast<T>(previous_value);
			}
			target_values_offset++;
			is_first_value = false;
		}

		while (target_values_offset < batch_size) {
			// Copy over any remaining data
			const idx_t next = MinValue(batch_size - target_values_offset,
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - unpacked_data_offset);
			if (next != 0) {
				for (idx_t i = 0; i < next; i++) {
					const auto &unpacked_value = unpacked_data[unpacked_data_offset + i];
					auto current_value = static_cast<T>(static_cast<uint64_t>(previous_value) +
					                                    static_cast<uint64_t>(min_delta) + unpacked_value);
					if (!SKIP_READ) {
						target_values[target_values_offset + i] = current_value;
					}
					previous_value = static_cast<int64_t>(current_value);
				}
				target_values_offset += next;
				unpacked_data_offset += next;
				continue;
			}

			// Move to next miniblock / block
			D_ASSERT(unpacked_data_offset == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
			D_ASSERT(miniblock_index < number_of_miniblocks_per_block);
			D_ASSERT(miniblock_offset <= number_of_values_in_a_miniblock);
			if (miniblock_offset == number_of_values_in_a_miniblock) {
				miniblock_offset = 0;
				if (++miniblock_index == number_of_miniblocks_per_block) {
					// <min delta> <list of bitwidths of miniblocks> <miniblocks>
					min_delta = ParquetDecodeUtils::ZigzagToInt(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_));
					buffer_.available(number_of_miniblocks_per_block);
					list_of_bitwidths_of_miniblocks = buffer_.ptr;
					buffer_.unsafe_inc(number_of_miniblocks_per_block);
					miniblock_index = 0;
				}
			}

			// Unpack from current miniblock
			ParquetDecodeUtils::BitUnpackAligned(buffer_, unpacked_data,
			                                     BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE,
			                                     list_of_bitwidths_of_miniblocks[miniblock_index]);
			unpacked_data_offset = 0;
			miniblock_offset += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}